

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O0

Amap_Item_t * Amap_LibertyCellArea(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Amap_Item_t *local_28;
  Amap_Item_t *pArea;
  Amap_Item_t *pCell_local;
  Amap_Tree_t *p_local;
  
  local_28 = Amap_LibertyItem(p,pCell->Child);
  while( true ) {
    if (local_28 == (Amap_Item_t *)0x0) {
      return (Amap_Item_t *)0x0;
    }
    iVar1 = Amap_LibertyCompare(p,local_28->Key,"area");
    if (iVar1 == 0) break;
    local_28 = Amap_LibertyItem(p,local_28->Next);
  }
  return local_28;
}

Assistant:

Amap_Item_t * Amap_LibertyCellArea( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pArea;
    Amap_ItemForEachChild( p, pCell, pArea )
    {
        if ( Amap_LibertyCompare(p, pArea->Key, "area") )
            continue;
        return pArea;
    }
    return NULL;
}